

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O0

QUuid createFromName(QUuid ns,QByteArrayView baseData,Algorithm algorithm,int version)

{
  long lVar1;
  initializer_list<QByteArrayView> iVar2;
  QSpan<const_QByteArrayView,_18446744073709551615UL> data;
  QSpan<std::byte,_18446744073709551615UL> buffer_00;
  ushort uVar3;
  QByteArrayView *in_RCX;
  short in_R9W;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QUuid QVar5;
  QByteArrayView hashResult;
  byte buffer [20];
  QUuid result;
  iterator in_stack_ffffffffffffff08;
  QSpan<std::byte,_18446744073709551615UL> *in_stack_ffffffffffffff10;
  Id128Bytes *in_stack_ffffffffffffff18;
  Endian in_stack_ffffffffffffff24;
  QByteArrayView *pQVar6;
  QUuid *in_stack_ffffffffffffff28;
  storage_type *psVar7;
  QByteArrayView local_68;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 local_18;
  uchar auStack_10 [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar8 = &DAT_aaaaaaaaaaaaaaaa;
  puVar9 = &DAT_aaaaaaaaaaaaaaaa;
  uVar10 = 0xaaaaaaaa;
  QSpan<std::byte,18446744073709551615ul>::QSpanBase<20ul>
            (in_stack_ffffffffffffff10,
             (type_identity_t<std::byte> (*) [20])in_stack_ffffffffffffff08);
  QUuid::toBytes(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  local_68 = QUuid::Id128Bytes::operator_cast_to_QByteArrayView(in_stack_ffffffffffffff18);
  pQVar6 = &local_68;
  psVar7 = (storage_type *)0x2;
  iVar2._M_len = (size_type)in_stack_ffffffffffffff10;
  iVar2._M_array = in_stack_ffffffffffffff08;
  QSpan<const_QByteArrayView,_18446744073709551615UL>::QSpanBase
            ((QSpan<const_QByteArrayView,_18446744073709551615UL> *)0x4617e7,iVar2);
  buffer_00.super_QSpanBase<std::byte,_18446744073709551615UL>.m_size._0_4_ = uVar10;
  buffer_00.super_QSpanBase<std::byte,_18446744073709551615UL>.m_data = puVar9;
  buffer_00.super_QSpanBase<std::byte,_18446744073709551615UL>.m_size._4_4_ =
       in_stack_ffffffffffffffcc;
  data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_size = (qsizetype)puVar8;
  data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_data = in_RCX;
  QVar4 = QCryptographicHash::hashInto
                    (buffer_00,data,(Algorithm)((ulong)&DAT_aaaaaaaaaaaaaaaa >> 0x20));
  QByteArrayView::truncate
            ((QByteArrayView *)&stack0xffffffffffffff68,(char *)0x10,(__off_t)QVar4.m_data);
  QVar4.m_data = psVar7;
  QVar4.m_size = (qsizetype)pQVar6;
  QVar5 = QUuid::fromRfc4122(QVar4);
  local_18 = QVar5._0_8_ & 0xfffffffffffffff;
  uVar3 = local_18._6_2_ | in_R9W << 0xc;
  local_18 = CONCAT26(uVar3,(undefined6)local_18);
  auStack_10[0] = QVar5.data4[0];
  auStack_10._1_7_ = QVar5.data4._1_7_;
  auStack_10[0] = auStack_10[0] & 0x3f | 0x80;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar5.data4[0] = auStack_10[0];
    QVar5.data4[1] = auStack_10[1];
    QVar5.data4[2] = auStack_10[2];
    QVar5.data4[3] = auStack_10[3];
    QVar5.data4[4] = auStack_10[4];
    QVar5.data4[5] = auStack_10[5];
    QVar5.data4[6] = auStack_10[6];
    QVar5.data4[7] = auStack_10[7];
    QVar5.data1 = (undefined4)local_18;
    QVar5.data2 = local_18._4_2_;
    QVar5.data3 = uVar3;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

static QUuid createFromName(QUuid ns, QByteArrayView baseData, QCryptographicHash::Algorithm algorithm, int version) noexcept
{
    std::byte buffer[20];
    Q_ASSERT(sizeof buffer >= size_t(QCryptographicHash::hashLength(algorithm)));
    QByteArrayView hashResult
        = QCryptographicHash::hashInto(buffer, {QByteArrayView{ns.toBytes()}, baseData}, algorithm);
    Q_ASSERT(hashResult.size() >= 16);
    hashResult.truncate(16); // Sha1 will be too long

    QUuid result = QUuid::fromRfc4122(hashResult);

    result.data3 &= 0x0FFF;
    result.data3 |= (version << 12);
    result.data4[0] &= 0x3F;
    result.data4[0] |= 0x80;

    return result;
}